

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Audio.cpp
# Opt level: O3

bool __thiscall
Amiga::Audio::Channel::output<(Amiga::Audio::Channel::State)4>(Channel *this,Channel *moduland)

{
  uint16_t *puVar1;
  byte bVar2;
  bool bVar3;
  
  puVar1 = &this->period_counter;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return false;
  }
  if ((this->dma_enabled == false) && ((this->interrupt_pending & 1U) != 0)) {
    this->state = Disabled;
    this->will_request_interrupt = false;
    return false;
  }
  this->state = PlayingHigh;
  this->output_level = *(int8_t *)((long)&this->data_latch + 1);
  this->volume_latch = this->volume;
  this->output_phase = '\0';
  if ((this->volume == '\0') || (this->attach_period != false)) {
    bVar2 = false;
  }
  else {
    bVar2 = this->attach_volume ^ 1;
  }
  this->output_enabled = (bool)bVar2;
  this->period_counter = this->period;
  this->data_latch = this->data;
  bVar3 = this->attach_volume;
  if ((moduland != (Channel *)0x0) && ((bVar3 & 1U) != 0)) {
    moduland->volume = (uint8_t)this->data;
  }
  if (((bVar3 & 1U) == 0) && (this->attach_period == true)) {
    bVar2 = this->dma_enabled;
  }
  else {
    bVar2 = this->dma_enabled;
    bVar3 = true;
    if ((bool)bVar2 != true) goto LAB_0020af52;
    this->wants_data = true;
    if (this->will_request_interrupt == true) {
      this->will_request_interrupt = false;
      goto LAB_0020af52;
    }
  }
  bVar3 = false;
LAB_0020af52:
  if (((bVar2 & 1) != 0) && (this->wants_data == false)) {
    puVar1 = &this->length_counter;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      this->length_counter = this->length;
      this->will_request_interrupt = true;
      this->should_reload_address = true;
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool Audio::Channel::output<Audio::Channel::State::PlayingLow>(Channel *moduland) {
	-- period_counter;

	if(!period_counter) {
		const bool dma_or_no_interrupt = dma_enabled || !interrupt_pending;
		if(dma_or_no_interrupt) {
			return transit<State::PlayingLow, State::PlayingHigh>(moduland);
		} else {
			return transit<State::PlayingLow, State::Disabled>(moduland);
		}
	}

	return false;
}